

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::StickyAtomTypesSectionParser::parseLine
          (StickyAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *pAVar2;
  RealType RVar3;
  StickyAdapter sa;
  string atomTypeName;
  StringTokenizer tokenizer;
  StickyAdapter local_e0;
  string local_d8;
  double local_b8;
  RealType local_b0;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  RealType local_90;
  double local_88;
  double local_80;
  StringTokenizer local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8," ;\t\n\r",(allocator<char> *)&local_e0);
  StringTokenizer::StringTokenizer(&local_78,line,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  iVar1 = StringTokenizer::countTokens(&local_78);
  if (iVar1 < 8) {
    snprintf(painCave.errMsg,2000,
             "StickyAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    local_88 = (this->options_->EnergyUnitScaling).data_;
    local_80 = (this->options_->DistanceUnitScaling).data_;
    StringTokenizer::nextToken_abi_cxx11_(&local_d8,&local_78);
    pAVar2 = ForceField::getAtomType(ff,&local_d8);
    if (pAVar2 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "StickyAtomTypesSectionParser Error: Can not find matching AtomType %s\n",
               local_d8._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_e0.at_ = pAVar2;
      local_90 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_98 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_a0 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_b8 = StringTokenizer::nextTokenAsDouble(&local_78);
      RVar3 = StringTokenizer::nextTokenAsDouble(&local_78);
      StickyAdapter::makeSticky
                (&local_e0,local_90,local_98 * local_88,local_a0 * local_88,local_a8 * local_80,
                 local_b0 * local_80,local_b8 * local_80,RVar3 * local_80,false);
    }
    std::__cxx11::string::~string((string *)&local_d8);
  }
  StringTokenizer::~StringTokenizer(&local_78);
  return;
}

Assistant:

void StickyAtomTypesSectionParser::parseLine(ForceField& ff,
                                               const string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens  = tokenizer.countTokens();
    RealType dus = options_.getDistanceUnitScaling();
    RealType eus = options_.getEnergyUnitScaling();

    // in AtomTypeSection, a line at least contains 8 tokens
    // atomTypeName and 7 different sticky parameters
    if (nTokens < 8) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAtomTypesSectionParser Error: Not enough "
               "tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      string atomTypeName = tokenizer.nextToken();
      AtomType* atomType  = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        StickyAdapter sa = StickyAdapter(atomType);

        RealType w0  = tokenizer.nextTokenAsDouble();
        RealType v0  = eus * tokenizer.nextTokenAsDouble();
        RealType v0p = eus * tokenizer.nextTokenAsDouble();
        RealType rl  = dus * tokenizer.nextTokenAsDouble();
        RealType ru  = dus * tokenizer.nextTokenAsDouble();
        RealType rlp = dus * tokenizer.nextTokenAsDouble();
        RealType rup = dus * tokenizer.nextTokenAsDouble();
        bool isPower = false;

        sa.makeSticky(w0, v0, v0p, rl, ru, rlp, rup, isPower);

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "StickyAtomTypesSectionParser Error: "
                 "Can not find matching AtomType %s\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }